

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::QStatusBar(QStatusBar *this,QWidget *parent)

{
  long lVar1;
  QStatusBarPrivate *pQVar2;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QStatusBarPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  QWidgetPrivate *this_00;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QStatusBarPrivate *)operator_new(0x2a8);
  QStatusBarPrivate::QStatusBarPrivate(pQVar2);
  this_00 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x6a2efd);
  QWidget::QWidget(in_RDI,in_RSI,(QWidget *)pQVar2,(WindowFlags)f.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1c530;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QStatusBar_00d1c6e0;
  pQVar2 = d_func((QStatusBar *)0x6a2f3a);
  pQVar2->box = (QBoxLayout *)0x0;
  pQVar2->timer = (QTimer *)0x0;
  pQVar2->resizer = (QSizeGrip *)0x0;
  setSizeGripEnabled((QStatusBar *)this_00,SUB81((ulong)pQVar2 >> 0x38,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QStatusBar::QStatusBar(QWidget * parent)
    : QWidget(*new QStatusBarPrivate, parent, { })
{
    Q_D(QStatusBar);
    d->box = nullptr;
    d->timer = nullptr;

#if QT_CONFIG(sizegrip)
    d->resizer = nullptr;
    setSizeGripEnabled(true); // causes reformat()
#else
    reformat();
#endif
}